

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<std::complex<long_double>,_1000> * __thiscall
TPZManVector<std::complex<long_double>,_1000>::operator=
          (TPZManVector<std::complex<long_double>,_1000> *this,
          TPZManVector<std::complex<long_double>,_1000> *copy)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  complex<long_double> *pcVar7;
  ulong uVar8;
  complex<long_double> *pcVar9;
  ulong uVar10;
  bool bVar11;
  
  if (this != copy) {
    uVar10 = (copy->super_TPZVec<std::complex<long_double>_>).fNElements;
    lVar6 = (this->super_TPZVec<std::complex<long_double>_>).fNAlloc;
    if ((lVar6 < (long)uVar10) &&
       (pcVar9 = (this->super_TPZVec<std::complex<long_double>_>).fStore,
       pcVar9 != this->fExtAlloc && pcVar9 != (complex<long_double> *)0x0)) {
      operator_delete__(pcVar9);
      (this->super_TPZVec<std::complex<long_double>_>).fStore = (complex<long_double> *)0x0;
      (this->super_TPZVec<std::complex<long_double>_>).fNAlloc = 0;
      lVar6 = 0;
    }
    if ((long)uVar10 < 0x3e9) {
      pcVar9 = (this->super_TPZVec<std::complex<long_double>_>).fStore;
      if (pcVar9 != (complex<long_double> *)0x0 && pcVar9 != this->fExtAlloc) {
        operator_delete__(pcVar9);
      }
      (this->super_TPZVec<std::complex<long_double>_>).fNAlloc = 0;
      (this->super_TPZVec<std::complex<long_double>_>).fStore = this->fExtAlloc;
    }
    else if (lVar6 < (long)uVar10) {
      pcVar7 = (complex<long_double> *)operator_new__(-(ulong)(uVar10 >> 0x3b != 0) | uVar10 * 0x20)
      ;
      pcVar9 = pcVar7;
      do {
        *(longdouble *)pcVar9->_M_value = (longdouble)0;
        *(longdouble *)((long)pcVar9->_M_value + 0x10) = (longdouble)0;
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != pcVar7 + uVar10);
      (this->super_TPZVec<std::complex<long_double>_>).fStore = pcVar7;
      (this->super_TPZVec<std::complex<long_double>_>).fNAlloc = uVar10;
    }
    (this->super_TPZVec<std::complex<long_double>_>).fNElements = uVar10;
    uVar8 = 0;
    if ((long)uVar10 < 1) {
      uVar10 = uVar8;
    }
    while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
      pcVar9 = (copy->super_TPZVec<std::complex<long_double>_>).fStore;
      pcVar7 = (this->super_TPZVec<std::complex<long_double>_>).fStore;
      puVar1 = (undefined8 *)(pcVar9->_M_value + uVar8);
      uVar3 = *puVar1;
      uVar4 = puVar1[1];
      puVar1 = (undefined8 *)(pcVar9->_M_value + uVar8 + 0x10);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)(pcVar7->_M_value + uVar8 + 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      puVar1 = (undefined8 *)(pcVar7->_M_value + uVar8);
      *puVar1 = uVar3;
      puVar1[1] = uVar4;
      uVar8 = uVar8 + 0x20;
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}